

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_casts.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::BindUnionToUnionCast
          (duckdb *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> _Var3;
  bool bVar4;
  idx_t iVar5;
  string *l1;
  idx_t iVar6;
  string *l2;
  LogicalType *target_00;
  reference pvVar7;
  ConversionException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar8;
  ulong index;
  string message;
  vector<unsigned_long,_true> tag_map;
  string local_128;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_108;
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> local_f0;
  idx_t local_e8;
  LogicalType *local_e0;
  GetCastFunctionInput local_d8;
  vector<unsigned_long,_true> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_f0._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
       (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)this;
  iVar5 = UnionType::GetMemberCount(source);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,iVar5,
             (allocator_type *)&local_128);
  local_108.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = iVar5;
  if (iVar5 != 0) {
    iVar5 = 0;
    do {
      local_e0 = UnionType::GetMemberType(source,iVar5);
      l1 = UnionType::GetMemberName_abi_cxx11_(source,iVar5);
      bVar8 = false;
      index = 0;
      do {
        iVar6 = UnionType::GetMemberCount(target);
        if (iVar6 <= index) break;
        l2 = UnionType::GetMemberName_abi_cxx11_(target,index);
        bVar4 = StringUtil::CIEquals(l1,l2);
        if (bVar4) {
          target_00 = UnionType::GetMemberType(target,index);
          pvVar7 = vector<unsigned_long,_true>::operator[](&local_c8,iVar5);
          *pvVar7 = index;
          local_d8.context.ptr = (input->context).ptr;
          local_d8.query_location.index = (input->query_location).index;
          CastFunctionSet::GetCastFunction
                    ((BoundCastInfo *)&local_128,input->function_set,local_e0,target_00,&local_d8);
          ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::
          emplace_back<duckdb::BoundCastInfo>(&local_108,(BoundCastInfo *)&local_128);
          if ((long *)local_128.field_2._M_allocated_capacity != (long *)0x0) {
            (**(code **)(*(long *)local_128.field_2._M_allocated_capacity + 8))();
          }
          bVar8 = true;
        }
        index = index + 1;
      } while (!bVar4);
      if (!bVar8) {
        local_90[0] = local_80;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,
                   "Type %s can\'t be cast as %s. The member \'%s\' is not present in target union",
                   "");
        LogicalType::ToString_abi_cxx11_(&local_50,source);
        LogicalType::ToString_abi_cxx11_(&local_70,target);
        pcVar1 = (l1->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + l1->_M_string_length);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_128,(StringUtil *)local_90,&local_50,&local_70,&local_b0,in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
        ConversionException::ConversionException(this_00,&local_128);
        __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != local_e8);
  }
  make_uniq<duckdb::UnionUnionBoundCastData,duckdb::vector<unsigned_long,true>&,duckdb::vector<duckdb::BoundCastInfo,true>,duckdb::LogicalType_const&>
            ((duckdb *)&local_128,&local_c8,(vector<duckdb::BoundCastInfo,_true> *)&local_108,target
            );
  _Var3._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       local_f0._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  _Var2._M_p = local_128._M_dataplus._M_p;
  local_128._M_dataplus._M_p = (pointer)0x0;
  *(pointer *)
   local_f0._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
   super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = _Var2._M_p;
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector(&local_108);
  if (local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
         _Var3._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundCastData> BindUnionToUnionCast(BindCastInput &input, const LogicalType &source,
                                               const LogicalType &target) {
	D_ASSERT(source.id() == LogicalTypeId::UNION);
	D_ASSERT(target.id() == LogicalTypeId::UNION);

	auto source_member_count = UnionType::GetMemberCount(source);

	auto tag_map = vector<idx_t>(source_member_count);
	auto member_casts = vector<BoundCastInfo>();

	for (idx_t source_idx = 0; source_idx < source_member_count; source_idx++) {
		auto &source_member_type = UnionType::GetMemberType(source, source_idx);
		auto &source_member_name = UnionType::GetMemberName(source, source_idx);

		bool found = false;
		for (idx_t target_idx = 0; target_idx < UnionType::GetMemberCount(target); target_idx++) {
			auto &target_member_name = UnionType::GetMemberName(target, target_idx);

			// found a matching member
			if (StringUtil::CIEquals(source_member_name, target_member_name)) {
				auto &target_member_type = UnionType::GetMemberType(target, target_idx);
				tag_map[source_idx] = target_idx;
				member_casts.push_back(input.GetCastFunction(source_member_type, target_member_type));
				found = true;
				break;
			}
		}
		if (!found) {
			// no matching member tag found in the target set
			auto message =
			    StringUtil::Format("Type %s can't be cast as %s. The member '%s' is not present in target union",
			                       source.ToString(), target.ToString(), source_member_name);
			throw ConversionException(message);
		}
	}

	return make_uniq<UnionUnionBoundCastData>(tag_map, std::move(member_casts), target);
}